

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxleastsqsc.hpp
# Opt level: O2

void soplex::
     updateScale<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
               (SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *vecnnzeroes,
               SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *resnvec,SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                        *tmpvec,undefined8 *psccurr,undefined8 *pscprev,
               cpp_dec_float<200U,_int,_void> *qcurr,cpp_dec_float<200U,_int,_void> *qprev,
               cpp_dec_float<200U,_int,_void> *param_8,cpp_dec_float<200U,_int,_void> *param_9,
               uint *param_10)

{
  undefined8 uVar1;
  uint uVar2;
  int iVar3;
  fpclass_type fVar4;
  int32_t iVar5;
  bool bVar6;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *vec;
  long lVar7;
  uint *puVar8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar9;
  uint *puVar10;
  byte bVar11;
  byte bVar12;
  double local_330;
  uint local_324 [27];
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_238;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1b8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_2;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_b0;
  
  bVar12 = 0;
  result.m_backend.fpclass = cpp_dec_float_finite;
  result.m_backend.prec_elem = 0x1c;
  result.m_backend.data._M_elems[0] = 0;
  result.m_backend.data._M_elems[1] = 0;
  result.m_backend.data._M_elems[2] = 0;
  result.m_backend.data._M_elems[3] = 0;
  result.m_backend.data._M_elems[4] = 0;
  result.m_backend.data._M_elems[5] = 0;
  result.m_backend.data._M_elems[6] = 0;
  result.m_backend.data._M_elems[7] = 0;
  result.m_backend.data._M_elems[8] = 0;
  result.m_backend.data._M_elems[9] = 0;
  result.m_backend.data._M_elems[10] = 0;
  result.m_backend.data._M_elems[0xb] = 0;
  result.m_backend.data._M_elems[0xc] = 0;
  result.m_backend.data._M_elems[0xd] = 0;
  result.m_backend.data._M_elems[0xe] = 0;
  result.m_backend.data._M_elems[0xf] = 0;
  result.m_backend.data._M_elems[0x10] = 0;
  result.m_backend.data._M_elems[0x11] = 0;
  result.m_backend.data._M_elems[0x12] = 0;
  result.m_backend.data._M_elems[0x13] = 0;
  result.m_backend.data._M_elems[0x14] = 0;
  result.m_backend.data._M_elems[0x15] = 0;
  result.m_backend.data._M_elems[0x16] = 0;
  result.m_backend.data._M_elems[0x17] = 0;
  result.m_backend.data._M_elems[0x18] = 0;
  result.m_backend.data._M_elems[0x19] = 0;
  result.m_backend.data._M_elems._104_5_ = 0;
  result.m_backend.data._M_elems[0x1b]._1_3_ = 0;
  result.m_backend.exp = 0;
  result.m_backend.neg = false;
  boost::multiprecision::default_ops::
  eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
            (&result.m_backend,param_8,param_9);
  uVar2 = result.m_backend.data._M_elems[0];
  puVar8 = result.m_backend.data._M_elems + 1;
  puVar10 = local_324;
  for (lVar7 = 0x1b; iVar3 = result.m_backend.exp, lVar7 != 0; lVar7 = lVar7 + -1) {
    *puVar10 = *puVar8;
    puVar8 = puVar8 + (ulong)bVar12 * -2 + 1;
    puVar10 = puVar10 + (ulong)bVar12 * -2 + 1;
  }
  fVar4 = result.m_backend.fpclass;
  iVar5 = result.m_backend.prec_elem;
  bVar11 = (uVar2 != 0 || result.m_backend.fpclass != cpp_dec_float_finite) ^ result.m_backend.neg;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
  ::operator-=((SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                *)*pscprev,
               (SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *)*psccurr);
  local_1b8.m_backend.data._M_elems[0] = uVar2;
  puVar8 = local_324;
  puVar10 = local_1b8.m_backend.data._M_elems + 1;
  for (lVar7 = 0x1b; lVar7 != 0; lVar7 = lVar7 + -1) {
    *puVar10 = *puVar8;
    puVar8 = puVar8 + (ulong)bVar12 * -2 + 1;
    puVar10 = puVar10 + (ulong)bVar12 * -2 + 1;
  }
  local_1b8.m_backend.exp = iVar3;
  local_1b8.m_backend.fpclass = fVar4;
  local_1b8.m_backend.prec_elem = iVar5;
  puVar8 = param_10;
  pnVar9 = &local_b0;
  for (lVar7 = 0x1c; lVar7 != 0; lVar7 = lVar7 + -1) {
    (pnVar9->m_backend).data._M_elems[0] = *puVar8;
    puVar8 = puVar8 + (ulong)bVar12 * -2 + 1;
    pnVar9 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *)((long)pnVar9 + ((ulong)bVar12 * -2 + 1) * 4);
  }
  local_b0.m_backend.exp = param_10[0x1c];
  local_b0.m_backend.neg = SUB41(param_10[0x1d],0);
  local_b0.m_backend.fpclass = param_10[0x1e];
  local_b0.m_backend.prec_elem = param_10[0x1f];
  local_1b8.m_backend.neg = (bool)bVar11;
  bVar6 = isZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                    (&local_1b8,&local_b0);
  if (bVar6) {
    SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::clear((SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *)*pscprev);
  }
  else {
    local_238.m_backend.data._M_elems[0] = uVar2;
    puVar8 = local_324;
    puVar10 = local_238.m_backend.data._M_elems + 1;
    for (lVar7 = 0x1b; lVar7 != 0; lVar7 = lVar7 + -1) {
      *puVar10 = *puVar8;
      puVar8 = puVar8 + (ulong)bVar12 * -2 + 1;
      puVar10 = puVar10 + (ulong)bVar12 * -2 + 1;
    }
    local_238.m_backend.exp = iVar3;
    local_238.m_backend.fpclass = fVar4;
    local_238.m_backend.prec_elem = iVar5;
    local_238.m_backend.neg = (bool)bVar11;
    SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
    ::operator*=((SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                  *)*pscprev,&local_238);
  }
  vec = SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
        ::
        assignPWproduct4setup<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                  (tmpvec,resnvec,vecnnzeroes);
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
  ::operator+=((SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                *)*pscprev,vec);
  local_330 = 1.0;
  result.m_backend.fpclass = cpp_dec_float_finite;
  result.m_backend.prec_elem = 0x1c;
  result.m_backend.data._M_elems[0] = 0;
  result.m_backend.data._M_elems[1] = 0;
  result.m_backend.data._M_elems[2] = 0;
  result.m_backend.data._M_elems[3] = 0;
  result.m_backend.data._M_elems[4] = 0;
  result.m_backend.data._M_elems[5] = 0;
  result.m_backend.data._M_elems[6] = 0;
  result.m_backend.data._M_elems[7] = 0;
  result.m_backend.data._M_elems[8] = 0;
  result.m_backend.data._M_elems[9] = 0;
  result.m_backend.data._M_elems[10] = 0;
  result.m_backend.data._M_elems[0xb] = 0;
  result.m_backend.data._M_elems[0xc] = 0;
  result.m_backend.data._M_elems[0xd] = 0;
  result.m_backend.data._M_elems[0xe] = 0;
  result.m_backend.data._M_elems[0xf] = 0;
  result.m_backend.data._M_elems[0x10] = 0;
  result.m_backend.data._M_elems[0x11] = 0;
  result.m_backend.data._M_elems[0x12] = 0;
  result.m_backend.data._M_elems[0x13] = 0;
  result.m_backend.data._M_elems[0x14] = 0;
  result.m_backend.data._M_elems[0x15] = 0;
  result.m_backend.data._M_elems[0x16] = 0;
  result.m_backend.data._M_elems[0x17] = 0;
  result.m_backend.data._M_elems[0x18] = 0;
  result.m_backend.data._M_elems[0x19] = 0;
  result.m_backend.data._M_elems._104_5_ = 0;
  result.m_backend.data._M_elems[0x1b]._1_3_ = 0;
  result.m_backend.exp = 0;
  result.m_backend.neg = false;
  boost::multiprecision::default_ops::
  eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
            (&result.m_backend,qcurr,qprev);
  result_2.m_backend.fpclass = cpp_dec_float_finite;
  result_2.m_backend.prec_elem = 0x1c;
  result_2.m_backend.data._M_elems[0] = 0;
  result_2.m_backend.data._M_elems[1] = 0;
  result_2.m_backend.data._M_elems[2] = 0;
  result_2.m_backend.data._M_elems[3] = 0;
  result_2.m_backend.data._M_elems[4] = 0;
  result_2.m_backend.data._M_elems[5] = 0;
  result_2.m_backend.data._M_elems[6] = 0;
  result_2.m_backend.data._M_elems[7] = 0;
  result_2.m_backend.data._M_elems[8] = 0;
  result_2.m_backend.data._M_elems[9] = 0;
  result_2.m_backend.data._M_elems[10] = 0;
  result_2.m_backend.data._M_elems[0xb] = 0;
  result_2.m_backend.data._M_elems[0xc] = 0;
  result_2.m_backend.data._M_elems[0xd] = 0;
  result_2.m_backend.data._M_elems[0xe] = 0;
  result_2.m_backend.data._M_elems[0xf] = 0;
  result_2.m_backend.data._M_elems[0x10] = 0;
  result_2.m_backend.data._M_elems[0x11] = 0;
  result_2.m_backend.data._M_elems[0x12] = 0;
  result_2.m_backend.data._M_elems[0x13] = 0;
  result_2.m_backend.data._M_elems[0x14] = 0;
  result_2.m_backend.data._M_elems[0x15] = 0;
  result_2.m_backend.data._M_elems[0x16] = 0;
  result_2.m_backend.data._M_elems[0x17] = 0;
  result_2.m_backend.data._M_elems[0x18] = 0;
  result_2.m_backend.data._M_elems[0x19] = 0;
  result_2.m_backend.data._M_elems._104_5_ = 0;
  result_2.m_backend.data._M_elems[0x1b]._1_3_ = 0;
  result_2.m_backend.exp = 0;
  result_2.m_backend.neg = false;
  boost::multiprecision::default_ops::
  eval_divide_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,double>
            (&result_2.m_backend,&local_330,&result.m_backend);
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
  ::operator*=((SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                *)*pscprev,
               (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)&result_2.m_backend);
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
  ::operator+=((SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                *)*pscprev,
               (SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *)*psccurr);
  uVar1 = *psccurr;
  *psccurr = *pscprev;
  *pscprev = uVar1;
  return;
}

Assistant:

static void updateScale(
   const SSVectorBase<R> vecnnzeroes,
   const SSVectorBase<R> resnvec,
   SSVectorBase<R>& tmpvec,
   SSVectorBase<R>*& psccurr,
   SSVectorBase<R>*& pscprev,
   R qcurr,
   R qprev,
   R eprev1,
   R eprev2,
   R epsilon)
{
   assert(psccurr != nullptr);
   assert(pscprev != nullptr);
   assert(qcurr * qprev != 0.0);

   R fac = -(eprev1 * eprev2);

   SSVectorBase<R>* pssv;

   *pscprev -= *psccurr;

   if(isZero(fac, epsilon))
      (*pscprev).clear();
   else
      *pscprev *= fac;

   *pscprev += tmpvec.assignPWproduct4setup(resnvec, vecnnzeroes);

   *pscprev *= 1.0 / (qcurr * qprev);
   *pscprev += *psccurr;

   /* swap pointers */
   pssv = psccurr;
   psccurr = pscprev;
   pscprev = pssv;
}